

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrimmedSurfaceClipping.h
# Opt level: O0

void __thiscall
anurbs::TrimmedSurfaceClipping::TrimmedSurfaceClipping
          (TrimmedSurfaceClipping *this,double tolerance,double unit)

{
  allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_> local_35 [20];
  allocator<anurbs::TrimTypes> local_21;
  double local_20;
  double unit_local;
  double tolerance_local;
  TrimmedSurfaceClipping *this_local;
  
  local_20 = unit;
  unit_local = tolerance;
  tolerance_local = (double)this;
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::vector(&this->m_paths);
  std::allocator<anurbs::TrimTypes>::allocator(&local_21);
  std::vector<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>::vector
            (&this->m_span_trim_type,0,&local_21);
  std::allocator<anurbs::TrimTypes>::~allocator(&local_21);
  std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>::allocator
            (local_35);
  std::
  vector<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>,_std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>_>
  ::vector(&this->m_span_polygons,0,local_35);
  std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>::~allocator
            (local_35);
  this->m_scale = local_20;
  this->m_tolerance = unit_local;
  std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::vector(&this->m_spans_u);
  std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::vector(&this->m_spans_v);
  return;
}

Assistant:

TrimmedSurfaceClipping(const double tolerance, const double unit)
        : m_tolerance(tolerance)
        , m_scale(unit)
        , m_span_polygons(0)
        , m_span_trim_type(0)
    {
    }